

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O1

asn_enc_rval_t *
SET_OF_encode_der(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *ptr,
                 int tag_mode,ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  uint uVar1;
  asn_TYPE_member_s *paVar2;
  asn_TYPE_descriptor_s *paVar3;
  der_type_encoder_f *pdVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  undefined8 *__ptr;
  void *pvVar8;
  size_t struct_length;
  undefined8 *puVar9;
  uint uVar10;
  _el_buffer *encoded_el;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong __size;
  bool bVar14;
  size_t local_90;
  long local_78;
  asn_enc_rval_t local_48;
  
  paVar2 = td->elements;
  paVar3 = paVar2->type;
  pdVar4 = paVar3->der_encoder;
  if (*(int *)((long)ptr + 8) < 1) {
    __size = 1;
    struct_length = 0;
  }
  else {
    __size = 1;
    lVar11 = 0;
    struct_length = 0;
    do {
      pvVar5 = *(void **)(*ptr + lVar11 * 8);
      if (pvVar5 == (void *)0x0) {
        bVar14 = false;
      }
      else {
        (*pdVar4)(__return_storage_ptr__,paVar3,pvVar5,0,paVar2->tag,(asn_app_consume_bytes_f *)0x0,
                  (void *)0x0);
        uVar6 = __return_storage_ptr__->encoded;
        if (uVar6 == 0xffffffffffffffff) {
          bVar14 = true;
        }
        else {
          struct_length = struct_length + uVar6;
          if (__size <= uVar6) {
            __size = uVar6;
          }
          bVar14 = false;
        }
      }
      if (bVar14) {
        return __return_storage_ptr__;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)((long)ptr + 8));
  }
  local_78 = der_write_tags(td,struct_length,tag_mode,1,tag,cb,app_key);
  if (local_78 == -1) {
LAB_00146621:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = ptr;
  }
  else {
    lVar11 = struct_length + local_78;
    if ((cb == (asn_app_consume_bytes_f *)0x0) || ((long)*(int *)((long)ptr + 8) == 0)) {
      __return_storage_ptr__->encoded = lVar11;
    }
    else {
      __ptr = (undefined8 *)malloc((long)*(int *)((long)ptr + 8) * 0x18);
      if (__ptr == (undefined8 *)0x0) goto LAB_00146621;
      uVar10 = 0;
      if (*(int *)((long)ptr + 8) < 1) {
        local_90 = 0;
      }
      else {
        local_90 = 0;
        do {
          pvVar5 = *(void **)(*ptr + (long)(int)uVar10 * 8);
          if (pvVar5 == (void *)0x0) {
            iVar7 = 9;
          }
          else {
            puVar9 = __ptr + local_90 * 3;
            pvVar8 = malloc(__size);
            *puVar9 = pvVar8;
            if (pvVar8 == (void *)0x0) {
              uVar1 = uVar10 - 1;
              bVar14 = 0 < (int)uVar10;
              uVar10 = uVar1;
              if (bVar14) {
                puVar9 = __ptr + (ulong)uVar1 * 3;
                lVar12 = (ulong)uVar1 + 1;
                do {
                  free((void *)*puVar9);
                  puVar9 = puVar9 + -3;
                  lVar13 = lVar12 + -1;
                  bVar14 = 0 < lVar12;
                  lVar12 = lVar13;
                } while (lVar13 != 0 && bVar14);
                uVar10 = 0xffffffff;
              }
              free(__ptr);
              __return_storage_ptr__->encoded = -1;
              __return_storage_ptr__->failed_type = td;
              __return_storage_ptr__->structure_ptr = ptr;
              iVar7 = 1;
            }
            else {
              puVar9[1] = 0;
              puVar9[2] = __size;
              (*pdVar4)(&local_48,paVar3,pvVar5,0,paVar2->tag,_el_addbytes,puVar9);
              __return_storage_ptr__->structure_ptr = local_48.structure_ptr;
              __return_storage_ptr__->encoded = local_48.encoded;
              __return_storage_ptr__->failed_type = local_48.failed_type;
              if (__return_storage_ptr__->encoded == -1) {
                if (-1 < (int)uVar10) {
                  puVar9 = __ptr + (ulong)uVar10 * 3;
                  lVar12 = (ulong)uVar10 + 1;
                  do {
                    free((void *)*puVar9);
                    puVar9 = puVar9 + -3;
                    lVar13 = lVar12 + -1;
                    bVar14 = 0 < lVar12;
                    lVar12 = lVar13;
                  } while (lVar13 != 0 && bVar14);
                  uVar10 = 0xffffffff;
                }
                free(__ptr);
                iVar7 = 1;
              }
              else {
                local_78 = local_78 + __return_storage_ptr__->encoded;
                local_90 = local_90 + 1;
                iVar7 = 0;
              }
            }
          }
          if ((iVar7 != 9) && (iVar7 != 0)) {
            return __return_storage_ptr__;
          }
          uVar10 = uVar10 + 1;
        } while ((int)uVar10 < *(int *)((long)ptr + 8));
      }
      qsort(__ptr,local_90,0x18,_el_buf_cmp);
      if ((long)local_90 < 1) {
        bVar14 = true;
      }
      else {
        iVar7 = 0;
        puVar9 = __ptr;
        do {
          bVar14 = iVar7 == 0;
          iVar7 = -1;
          if (bVar14) {
            iVar7 = (*cb)((void *)*puVar9,puVar9[1],app_key);
            iVar7 = iVar7 >> 0x1f;
          }
          free((void *)*puVar9);
          puVar9 = puVar9 + 3;
          local_90 = local_90 - 1;
        } while (local_90 != 0);
        bVar14 = iVar7 == 0;
      }
      free(__ptr);
      if ((bVar14) && (lVar11 == local_78)) {
        __return_storage_ptr__->encoded = lVar11;
      }
      else {
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        __return_storage_ptr__->structure_ptr = ptr;
      }
    }
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_der(asn_TYPE_descriptor_t *td, void *ptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	asn_TYPE_member_t *elm = td->elements;
	asn_TYPE_descriptor_t *elm_type = elm->type;
	der_type_encoder_f *der_encoder = elm_type->der_encoder;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(ptr);
	size_t computed_size = 0;
	ssize_t encoding_size = 0;
	struct _el_buffer *encoded_els;
	ssize_t eels_count = 0;
	size_t max_encoded_len = 1;
	asn_enc_rval_t erval;
	int ret;
	int edx;

	ASN_DEBUG("Estimating size for SET OF %s", td->name);

	/*
	 * Gather the length of the underlying members sequence.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		if(!memb_ptr) continue;
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag, 0, 0);
		if(erval.encoded == -1)
			return erval;
		computed_size += erval.encoded;

		/* Compute maximum encoding's size */
		if(max_encoded_len < (size_t)erval.encoded)
			max_encoded_len = erval.encoded;
	}

	/*
	 * Encode the TLV for the sequence itself.
	 */
	encoding_size = der_write_tags(td, computed_size, tag_mode, 1, tag,
		cb, app_key);
	if(encoding_size == -1) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}
	computed_size += encoding_size;

	if(!cb || list->count == 0) {
		erval.encoded = computed_size;
		ASN__ENCODED_OK(erval);
	}

	/*
	 * DER mandates dynamic sorting of the SET OF elements
	 * according to their encodings. Build an array of the
	 * encoded elements.
	 */
	encoded_els = (struct _el_buffer *)MALLOC(
				list->count * sizeof(encoded_els[0]));
	if(encoded_els == NULL) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}

	ASN_DEBUG("Encoding members of %s SET OF", td->name);

	/*
	 * Encode all members.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		struct _el_buffer *encoded_el = &encoded_els[eels_count];

		if(!memb_ptr) continue;

		/*
		 * Prepare space for encoding.
		 */
		encoded_el->buf = (uint8_t *)MALLOC(max_encoded_len);
		if(encoded_el->buf) {
			encoded_el->length = 0;
			encoded_el->size = max_encoded_len;
		} else {
			for(edx--; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			erval.encoded = -1;
			erval.failed_type = td;
			erval.structure_ptr = ptr;
			return erval;
		}

		/*
		 * Encode the member into the prepared space.
		 */
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag,
			_el_addbytes, encoded_el);
		if(erval.encoded == -1) {
			for(; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			return erval;
		}
		encoding_size += erval.encoded;
		eels_count++;
	}

	/*
	 * Sort the encoded elements according to their encoding.
	 */
	qsort(encoded_els, eels_count, sizeof(encoded_els[0]), _el_buf_cmp);

	/*
	 * Report encoded elements to the application.
	 * Dispose of temporary sorted members table.
	 */
	ret = 0;
	for(edx = 0; edx < eels_count; edx++) {
		struct _el_buffer *encoded_el = &encoded_els[edx];
		/* Report encoded chunks to the application */
		if(ret == 0
		&& cb(encoded_el->buf, encoded_el->length, app_key) < 0)
			ret = -1;
		FREEMEM(encoded_el->buf);
	}
	FREEMEM(encoded_els);

	if(ret || computed_size != (size_t)encoding_size) {
		/*
		 * Standard callback failed, or
		 * encoded size is not equal to the computed size.
		 */
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
	} else {
		erval.encoded = computed_size;
	}

	ASN__ENCODED_OK(erval);
}